

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O1

void bf_write_buffer(bfile_t *bfile)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = bfile->pos - bfile->ipos;
  if (uVar3 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      sVar1 = fwrite(bfile->buffer + uVar2 + bfile->ipos % (ulong)bfile->buffer_size,1,uVar3 - uVar2
                     ,(FILE *)bfile->file);
      if (sVar1 == 0) {
        bf_write_buffer_cold_1();
      }
      else {
        uVar2 = uVar2 + sVar1;
      }
    } while (uVar2 < uVar3);
  }
  bfile->ipos = bfile->ipos + uVar2;
  return;
}

Assistant:

static
void
bf_write_buffer(
    bfile_t * bfile )
{
    size_t written, towrite;

    assert( bfile != NULL );
    assert( bfile->file != NULL );
    assert( (bfile->flags & BF_WRITABLE) != FALSE );

    towrite = bfile->pos - bfile->ipos;
    written = 0;
    while ( written < towrite ) {
        size_t res, bufpos;
        bufpos = bfile->ipos % bfile->buffer_size;
        res = fwrite( bfile->buffer + bufpos + written, 1, 
                      towrite - written, bfile->file );
        if ( res != 0 ) {
            written += res;
        } else {
            fprintf( stderr, "Error: fwrite() returned 0.\n" );
        }
    }

    bfile->ipos += written;
}